

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O3

aspa_hop_result aspa_check_hop(aspa_table *aspa_table,uint32_t customer_asn,uint32_t provider_asn)

{
  long lVar1;
  bool bVar2;
  aspa_hop_result aVar3;
  aspa_record *paVar4;
  uint32_t *puVar5;
  size_t sVar6;
  ulong uVar7;
  aspa_store_node *paVar8;
  byte bVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  paVar8 = aspa_table->store;
  if (paVar8 == (aspa_store_node *)0x0) {
    aVar3 = ASPA_NO_ATTESTATION;
  }
  else {
    bVar9 = 0;
    do {
      paVar4 = aspa_array_search(paVar8->aspa_array,customer_asn);
      if (paVar4 != (aspa_record *)0x0) {
        bVar9 = 1;
        if (paVar4->provider_count != 0) {
          puVar5 = paVar4->provider_asns;
          sVar6 = paVar4->provider_count;
          do {
            uVar7 = sVar6 >> 1;
            if (provider_asn == puVar5[uVar7]) {
              aVar3 = ASPA_PROVIDER_PLUS;
              goto LAB_0010764b;
            }
            if (-1 < (int)(provider_asn - puVar5[uVar7])) {
              puVar5 = puVar5 + uVar7;
            }
            bVar2 = 1 < sVar6;
            sVar6 = sVar6 - uVar7;
          } while (bVar2);
        }
      }
      paVar8 = paVar8->next;
    } while (paVar8 != (aspa_store_node *)0x0);
    aVar3 = (aspa_hop_result)bVar9;
  }
LAB_0010764b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aVar3;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_hop_result aspa_check_hop(struct aspa_table *aspa_table, uint32_t customer_asn, uint32_t provider_asn)
{
	bool customer_found = false;

	for (struct aspa_store_node *node = aspa_table->store; node != NULL; node = node->next) {
		struct aspa_record *aspa_record = aspa_array_search(node->aspa_array, customer_asn);

		if (!aspa_record)
			continue;

		customer_found = true;

		// Provider ASNs are sorted in ascending order.
		// We consider this an implementation detail, callers must not make any assumptions on the
		// ordering of provider ASNs.
		uint32_t *provider =
			binary_search_asns(provider_asn, aspa_record->provider_asns, aspa_record->provider_count);

		if (provider)
			return ASPA_PROVIDER_PLUS;
	}

	return customer_found ? ASPA_NOT_PROVIDER_PLUS : ASPA_NO_ATTESTATION;
}